

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perftest.c
# Opt level: O2

int run(int validate_utf8)

{
  int iVar1;
  yajl_status yVar2;
  int iVar3;
  uint uVar4;
  yajl_handle h;
  char **ppcVar5;
  size_t sVar6;
  undefined **ppuVar7;
  uchar *puVar8;
  long lVar9;
  int iVar10;
  double dVar11;
  double dVar12;
  
  dVar11 = mygettime();
  lVar9 = 0;
  do {
    dVar12 = mygettime();
    if (3.0 <= dVar12 - dVar11) break;
    iVar10 = (int)lVar9;
    for (; iVar10 + 100 != (int)lVar9; lVar9 = lVar9 + 1) {
      h = yajl_alloc((yajl_callbacks *)0x0,(yajl_alloc_funcs *)0x0,(void *)0x0);
      yajl_config(h,yajl_dont_validate_strings,(ulong)(validate_utf8 == 0));
      iVar1 = num_docs();
      for (ppcVar5 = get_doc((int)(lVar9 % (long)iVar1)); puVar8 = (uchar *)*ppcVar5,
          puVar8 != (uchar *)0x0; ppcVar5 = ppcVar5 + 1) {
        sVar6 = strlen((char *)puVar8);
        yVar2 = yajl_parse(h,puVar8,sVar6);
        if (yVar2 != yajl_status_ok) break;
      }
      yVar2 = yajl_complete_parse(h);
      if (yVar2 != yajl_status_ok) {
        puVar8 = (uchar *)*ppcVar5;
        if (puVar8 == (uchar *)0x0) {
          sVar6 = 0;
        }
        else {
          sVar6 = strlen((char *)puVar8);
        }
        puVar8 = yajl_get_error(h,1,puVar8,sVar6);
        fputs((char *)puVar8,_stderr);
        yajl_free_error(h,puVar8);
        return 1;
      }
      yajl_free(h);
    }
  } while (dVar12 - dVar11 < 3.0);
  dVar12 = mygettime();
  iVar10 = 0;
  for (iVar1 = 0; iVar3 = num_docs(), iVar1 < iVar3; iVar1 = iVar1 + 1) {
    uVar4 = doc_size(iVar1);
    iVar10 = iVar10 + uVar4;
  }
  iVar1 = num_docs();
  ppuVar7 = &PTR_anon_var_dwarf_9d_0011cdc8;
  for (dVar11 = (double)(lVar9 * (iVar10 / iVar1)) / (dVar12 - dVar11);
      (*ppuVar7 != (undefined *)0x0 && (1024.0 < dVar11)); dVar11 = dVar11 * 0.0009765625) {
    ppuVar7 = ppuVar7 + 1;
  }
  printf("Parsing speed: %g %s\n",ppuVar7[-1],(long)iVar10 % (long)iVar1 & 0xffffffff);
  return 0;
}

Assistant:

static int
run(int validate_utf8)
{
    long long times = 0; 
    double starttime;

    starttime = mygettime();

    /* allocate a parser */
    for (;;) {
		int i;
        {
            double now = mygettime();
            if (now - starttime >= PARSE_TIME_SECS) break;
        }

        for (i = 0; i < 100; i++) {
            yajl_handle hand = yajl_alloc(NULL, NULL, NULL);
            yajl_status stat;        
            const char ** d;

            yajl_config(hand, yajl_dont_validate_strings, validate_utf8 ? 0 : 1);

            for (d = get_doc(times % num_docs()); *d; d++) {
                stat = yajl_parse(hand, (unsigned char *) *d, strlen(*d));
                if (stat != yajl_status_ok) break;
            }
            
            stat = yajl_complete_parse(hand);

            if (stat != yajl_status_ok) {
                unsigned char * str =
                    yajl_get_error(hand, 1,
                                   (unsigned char *) *d,
                                   (*d ? strlen(*d) : 0));
                fprintf(stderr, "%s", (const char *) str);
                yajl_free_error(hand, str);
                return 1;
            }
            yajl_free(hand);
            times++;
        }
    }

    /* parsed doc 'times' times */
    {
        double throughput;
        double now;
        const char * all_units[] = { "B/s", "KB/s", "MB/s", (char *) 0 };
        const char ** units = all_units;
        int i, avg_doc_size = 0;

        now = mygettime();

        for (i = 0; i < num_docs(); i++) avg_doc_size += doc_size(i);
        avg_doc_size /= num_docs();

        throughput = (times * avg_doc_size) / (now - starttime);
        
        while (*(units + 1) && throughput > 1024) {
            throughput /= 1024;
            units++;
        }
        
        printf("Parsing speed: %g %s\n", throughput, *units);
    }

    return 0;
}